

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O0

void MWT::finish_example(vw *all,mwt *c,example *ec)

{
  float *pfVar1;
  int **ppiVar2;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  v_array<float> temp;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  float loss;
  bool in_stack_000001e7;
  multi_ex *in_stack_000001e8;
  example *in_stack_000001f0;
  undefined7 in_stack_000001f8;
  undefined1 in_stack_000001ff;
  undefined4 in_stack_00000200;
  int in_stack_00000204;
  example *in_stack_ffffffffffffff88;
  vw *in_stack_ffffffffffffff90;
  v_array<float> local_68;
  int local_3c;
  int *local_38;
  int *local_30;
  v_array<int> *local_28;
  float local_1c;
  long local_18;
  long local_10;
  undefined8 *local_8;
  
  local_1c = 0.0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (((*(byte *)(in_RSI + 0x154) & 1) != 0) && (*(long *)(in_RSI + 0x120) != 0)) {
    in_stack_ffffffffffffff90 = *(vw **)(in_RSI + 0x120);
    pfVar1 = v_array<float>::operator[]((v_array<float> *)(in_RDX + 0x6850),0);
    local_1c = CB_ALGS::get_unbiased_cost
                         ((cb_class *)in_stack_ffffffffffffff90,(uint32_t)(long)*pfVar1,0.0);
  }
  shared_data::update((shared_data *)*local_8,(bool)(*(byte *)(local_18 + 0x68c8) & 1),
                      *(long *)(local_10 + 0x120) != 0,local_1c,1.0,*(size_t *)(local_18 + 0x68a0));
  local_28 = (v_array<int> *)(local_8 + 0x6a2);
  ppiVar2 = v_array<int>::begin(local_28);
  local_30 = *ppiVar2;
  ppiVar2 = v_array<int>::end(local_28);
  local_38 = *ppiVar2;
  for (; local_30 != local_38; local_30 = local_30 + 1) {
    local_3c = *local_30;
    print_scalars(in_stack_00000204,(v_array<float> *)CONCAT17(in_stack_000001ff,in_stack_000001f8),
                  (v_array<char> *)in_stack_000001f0);
  }
  if ((*(byte *)(local_10 + 0x154) & 1) != 0) {
    local_68._begin = *(float **)(local_18 + 0x6850);
    local_68._end = *(float **)(local_18 + 0x6858);
    local_68.end_array = *(float **)(local_18 + 0x6860);
    local_68.erase_count = *(size_t *)(local_18 + 0x6868);
    pfVar1 = v_array<float>::operator[](&local_68,0);
    *(int *)(local_18 + 0x6850) = (int)(long)*pfVar1;
    CB::print_update((vw *)CONCAT44(in_stack_00000204,in_stack_00000200),(bool)in_stack_000001ff,
                     in_stack_000001f0,in_stack_000001e8,in_stack_000001e7);
    *(float **)(local_18 + 0x6850) = local_68._begin;
    *(float **)(local_18 + 0x6858) = local_68._end;
    *(float **)(local_18 + 0x6860) = local_68.end_array;
    *(size_t *)(local_18 + 0x6868) = local_68.erase_count;
  }
  VW::finish_example(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void finish_example(vw& all, mwt& c, example& ec)
{
  float loss = 0.;
  if (c.learn)
    if (c.observation != nullptr)
      loss = get_unbiased_cost(c.observation, (uint32_t)ec.pred.scalars[0]);
  all.sd->update(ec.test_only, c.observation != nullptr, loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink) print_scalars(sink, ec.pred.scalars, ec.tag);

  if (c.learn)
  {
    v_array<float> temp = ec.pred.scalars;
    ec.pred.multiclass = (uint32_t)temp[0];
    CB::print_update(all, c.observation != nullptr, ec, nullptr, false);
    ec.pred.scalars = temp;
  }
  VW::finish_example(all, ec);
}